

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_utils.cpp
# Opt level: O1

wins * create_wins_array(int argc,char **argv,int *ar_len)

{
  int iVar1;
  wins *pwVar2;
  Am_Drawonable *pAVar3;
  ulong uVar4;
  char *pcVar5;
  
  iVar1 = argc + (uint)(argc == 0);
  uVar4 = 0xffffffffffffffff;
  if (-1 < iVar1) {
    uVar4 = (long)iVar1 << 6;
  }
  pwVar2 = (wins *)operator_new__(uVar4);
  if (argc < 2) {
    pcVar5 = (char *)0x0;
  }
  else {
    if (argc == 3) {
      pAVar3 = (Am_Drawonable *)Am_Drawonable::Get_Root_Drawonable(argv[1]);
      pwVar2->root = pAVar3;
      pAVar3 = (Am_Drawonable *)Am_Drawonable::Get_Root_Drawonable(argv[2]);
      pwVar2[1].root = pAVar3;
      iVar1 = 2;
      goto LAB_00105671;
    }
    if (argc != 2) {
      return pwVar2;
    }
    pcVar5 = argv[1];
  }
  pAVar3 = (Am_Drawonable *)Am_Drawonable::Get_Root_Drawonable(pcVar5);
  pwVar2->root = pAVar3;
  iVar1 = 1;
LAB_00105671:
  *ar_len = iVar1;
  return pwVar2;
}

Assistant:

wins *
create_wins_array(int argc, char **argv, int &ar_len)
{
  wins *wins_array = new wins[argc ? argc : 1];
  // On the Mac, argc is 0.  On Unix and PC, it is at least 1.
  if (argc <= 1) {
    wins_array[0].root = Am_Drawonable::Get_Root_Drawonable();
    ar_len = 1;
  } else if (argc == 2) {
    wins_array[0].root = Am_Drawonable::Get_Root_Drawonable(argv[1]);
    ar_len = 1;
  } else if (argc == 3) {
    wins_array[0].root = Am_Drawonable::Get_Root_Drawonable(argv[1]);
    wins_array[1].root = Am_Drawonable::Get_Root_Drawonable(argv[2]);
    ar_len = 2;
  }
  return wins_array;
}